

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryBasicClass.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::geometry::GeometryExpanderRenderTestInstance::iterate
          (TestStatus *__return_storage_ptr__,GeometryExpanderRenderTestInstance *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  pointer pVVar3;
  pointer pVVar4;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var5;
  void *pvVar6;
  Context *context;
  pointer pcVar7;
  undefined8 uVar8;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  Handle<(vk::HandleType)8> obj;
  Allocation *pAVar9;
  TestStatus *pTVar10;
  undefined8 renderPass;
  bool bVar11;
  deUint32 queueFamilyIndex;
  VkBool32 VVar12;
  int iVar13;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *allocator;
  const_iterator cVar14;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  size_t sVar15;
  GraphicsPipelineBuilder *pGVar16;
  TextureFormat format;
  long lVar17;
  int iVar18;
  char *__s;
  VkDeviceSize bufferSize;
  long lVar19;
  VkDeviceSize bufferSize_00;
  VkImageSubresourceLayers subresourceLayers;
  VkExtent3D extent;
  VkVertexInputAttributeDescription vertexAttribute;
  IVec2 resolution;
  Vec4 clearColor;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378;
  VkStructureType local_368 [2];
  undefined4 uStack_360;
  undefined4 uStack_35c;
  VkAccessFlags local_358;
  VkAccessFlags VStack_354;
  VkImageLayout VStack_350;
  VkImageLayout VStack_34c;
  Allocator *local_340;
  Buffer vertexBuffer;
  Buffer colorBuffer;
  string geometryShaderName;
  Deleter<vk::Handle<(vk::HandleType)17>_> DStack_2b0;
  TestStatus *local_290;
  VkQueue local_288;
  long local_280;
  string local_278;
  Image colorAttachmentImage;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_1d0;
  VkCommandPool local_1b8;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_1b0;
  VkFramebuffer local_198;
  Deleter<vk::Handle<(vk::HandleType)23>_> DStack_190;
  VkImageView local_178;
  Deleter<vk::Handle<(vk::HandleType)13>_> DStack_170;
  Move<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  VkImageMemoryBarrier colorAttachmentLayoutBarrier;
  
  local_290 = __return_storage_ptr__;
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  local_288 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  allocator = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  resolution.m_data[0] = 0x100;
  resolution.m_data[1] = 0x100;
  makeImageCreateInfo((VkImageCreateInfo *)&colorAttachmentLayoutBarrier,&resolution,
                      VK_FORMAT_R8G8B8A8_UNORM,0x11,1);
  local_340 = allocator;
  Image::Image(&colorAttachmentImage,vk,device,allocator,
               (VkImageCreateInfo *)&colorAttachmentLayoutBarrier,(MemoryRequirement)0x0);
  makeRenderPass((Move<vk::Handle<(vk::HandleType)17>_> *)&colorAttachmentLayoutBarrier,vk,device,
                 VK_FORMAT_R8G8B8A8_UNORM);
  renderPass = colorAttachmentLayoutBarrier._0_8_;
  DStack_2b0.m_device._0_4_ = colorAttachmentLayoutBarrier.srcAccessMask;
  DStack_2b0.m_device._4_4_ = colorAttachmentLayoutBarrier.dstAccessMask;
  DStack_2b0.m_allocator._0_4_ = colorAttachmentLayoutBarrier.oldLayout;
  DStack_2b0.m_allocator._4_4_ = colorAttachmentLayoutBarrier.newLayout;
  DStack_2b0.m_deviceIface._0_4_ = colorAttachmentLayoutBarrier.pNext._0_4_;
  DStack_2b0.m_deviceIface._4_4_ = colorAttachmentLayoutBarrier.pNext._4_4_;
  (*(this->super_TestInstance)._vptr_TestInstance[3])(&pipelineLayout,this,vk,device);
  subresourceRange.levelCount = 1;
  subresourceRange.baseArrayLayer = 0;
  subresourceRange.aspectMask = 1;
  subresourceRange.baseMipLevel = 0;
  subresourceRange.layerCount = 1;
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&colorAttachmentLayoutBarrier,vk,device,
                (VkImage)colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                         m_data.object.m_internal,VK_IMAGE_VIEW_TYPE_2D,VK_FORMAT_R8G8B8A8_UNORM,
                subresourceRange);
  local_178.m_internal = colorAttachmentLayoutBarrier._0_8_;
  DStack_170.m_deviceIface = (DeviceInterface *)colorAttachmentLayoutBarrier.pNext;
  makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)&colorAttachmentLayoutBarrier,vk,device,
                  (VkRenderPass)renderPass,(VkImageView)colorAttachmentLayoutBarrier._0_8_,
                  resolution.m_data[0],resolution.m_data[1],1);
  local_198.m_internal = colorAttachmentLayoutBarrier._0_8_;
  DStack_190.m_deviceIface = (DeviceInterface *)colorAttachmentLayoutBarrier.pNext;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&colorAttachmentLayoutBarrier,vk,device,2,
             queueFamilyIndex,(VkAllocationCallbacks *)0x0);
  local_1b8.m_internal = colorAttachmentLayoutBarrier._0_8_;
  DStack_1b0.m_deviceIface = (DeviceInterface *)colorAttachmentLayoutBarrier.pNext;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&colorAttachmentLayoutBarrier,vk,device,
             (VkCommandPool)colorAttachmentLayoutBarrier._0_8_,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_358 = colorAttachmentLayoutBarrier.srcAccessMask;
  VStack_354 = colorAttachmentLayoutBarrier.dstAccessMask;
  VStack_350 = colorAttachmentLayoutBarrier.oldLayout;
  VStack_34c = colorAttachmentLayoutBarrier.newLayout;
  local_368[0] = colorAttachmentLayoutBarrier.sType;
  local_368[1] = colorAttachmentLayoutBarrier._4_4_;
  uStack_360 = colorAttachmentLayoutBarrier.pNext._0_4_;
  uStack_35c = colorAttachmentLayoutBarrier.pNext._4_4_;
  pVVar3 = (this->m_vertexAttrData).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_280 = (long)(this->m_vertexPosData).
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_vertexPosData).
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  pVVar4 = (this->m_vertexAttrData).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  p_Var5 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)((this->super_TestInstance).m_context)->m_progCollection;
  __s = "geometry_pointsize";
  colorAttachmentLayoutBarrier._0_8_ = &colorAttachmentLayoutBarrier.srcAccessMask;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&colorAttachmentLayoutBarrier,"geometry_pointsize","");
  cVar14 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var5,(key_type *)&colorAttachmentLayoutBarrier);
  if ((_Rb_tree_header *)cVar14._M_node == &(p_Var5->_M_impl).super__Rb_tree_header) {
    __s = "geometry";
  }
  else {
    vki = Context::getInstanceInterface((this->super_TestInstance).m_context);
    physDevice = Context::getPhysicalDevice((this->super_TestInstance).m_context);
    VVar12 = checkPointSize(vki,physDevice);
    if (VVar12 == 0) {
      __s = "geometry";
    }
  }
  geometryShaderName._M_dataplus._M_p = (pointer)&geometryShaderName.field_2;
  sVar15 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&geometryShaderName,__s,__s + sVar15);
  if ((VkAccessFlags *)colorAttachmentLayoutBarrier._0_8_ !=
      &colorAttachmentLayoutBarrier.srcAccessMask) {
    operator_delete((void *)colorAttachmentLayoutBarrier._0_8_,
                    CONCAT44(colorAttachmentLayoutBarrier.dstAccessMask,
                             colorAttachmentLayoutBarrier.srcAccessMask) + 1);
  }
  memset(&colorAttachmentLayoutBarrier,0,0xfc);
  colorAttachmentLayoutBarrier.sType = resolution.m_data[0];
  colorAttachmentLayoutBarrier._4_4_ = resolution.m_data[1];
  p_Var5 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)((this->super_TestInstance).m_context)->m_progCollection;
  vertexBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
       (deUint64)
       &vertexBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  std::__cxx11::string::_M_construct<char_const*>((string *)&vertexBuffer,"vertex","");
  cVar14 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var5,(key_type *)&vertexBuffer);
  pGVar16 = GraphicsPipelineBuilder::setShader
                      ((GraphicsPipelineBuilder *)&colorAttachmentLayoutBarrier,vk,device,
                       VK_SHADER_STAGE_VERTEX_BIT,*(ProgramBinary **)(cVar14._M_node + 2),
                       (VkSpecializationInfo *)0x0);
  cVar14 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                   *)((this->super_TestInstance).m_context)->m_progCollection,&geometryShaderName);
  pGVar16 = GraphicsPipelineBuilder::setShader
                      (pGVar16,vk,device,VK_SHADER_STAGE_GEOMETRY_BIT,
                       *(ProgramBinary **)(cVar14._M_node + 2),(VkSpecializationInfo *)0x0);
  p_Var5 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)((this->super_TestInstance).m_context)->m_progCollection;
  clearColor.m_data._0_8_ = &local_378;
  std::__cxx11::string::_M_construct<char_const*>((string *)&clearColor,"fragment","");
  cVar14 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var5,(key_type *)&clearColor);
  pGVar16 = GraphicsPipelineBuilder::setShader
                      (pGVar16,vk,device,VK_SHADER_STAGE_FRAGMENT_BIT,
                       *(ProgramBinary **)(cVar14._M_node + 2),(VkSpecializationInfo *)0x0);
  pGVar16 = GraphicsPipelineBuilder::addVertexBinding
                      (pGVar16,(VkVertexInputBindingDescription)ZEXT812(0x2000000000));
  pGVar16 = GraphicsPipelineBuilder::addVertexAttribute
                      (pGVar16,(VkVertexInputAttributeDescription)(ZEXT816(0x6d) << 0x40));
  vertexAttribute.format = VK_FORMAT_R32G32B32A32_SFLOAT;
  vertexAttribute.offset = 0x10;
  vertexAttribute.location = 1;
  vertexAttribute.binding = 0;
  pGVar16 = GraphicsPipelineBuilder::addVertexAttribute(pGVar16,vertexAttribute);
  pGVar16->m_primitiveTopology = this->m_primitiveType;
  GraphicsPipelineBuilder::build
            ((Move<vk::Handle<(vk::HandleType)18>_> *)&colorBuffer,pGVar16,vk,device,
             (VkPipelineLayout)
             pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal,
             (VkRenderPass)renderPass);
  obj = colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object;
  DStack_1d0.m_device =
       colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  DStack_1d0.m_allocator =
       colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator
  ;
  DStack_1d0.m_deviceIface =
       colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
       m_deviceIface;
  colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)clearColor.m_data._0_8_ != &local_378) {
    operator_delete((void *)clearColor.m_data._0_8_,local_378._M_allocated_capacity + 1);
  }
  if ((VkDevice *)
      vertexBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
      != &vertexBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
          m_device) {
    operator_delete((void *)vertexBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.
                            m_data.object.m_internal,
                    (ulong)(vertexBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.
                            m_data.deleter.m_device + 1));
  }
  GraphicsPipelineBuilder::~GraphicsPipelineBuilder
            ((GraphicsPipelineBuilder *)&colorAttachmentLayoutBarrier);
  iVar18 = resolution.m_data[1] * resolution.m_data[0];
  format = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  iVar13 = tcu::getPixelSize(format);
  bufferSize = (VkDeviceSize)(iVar18 * iVar13);
  makeBufferCreateInfo((VkBufferCreateInfo *)&colorAttachmentLayoutBarrier,bufferSize,2);
  geometry::Buffer::Buffer
            (&colorBuffer,vk,device,local_340,(VkBufferCreateInfo *)&colorAttachmentLayoutBarrier,
             (MemoryRequirement)0x1);
  bufferSize_00 = (long)pVVar3 + (local_280 - (long)pVVar4);
  makeBufferCreateInfo((VkBufferCreateInfo *)&colorAttachmentLayoutBarrier,bufferSize_00,0x80);
  geometry::Buffer::Buffer
            (&vertexBuffer,vk,device,local_340,(VkBufferCreateInfo *)&colorAttachmentLayoutBarrier,
             (MemoryRequirement)0x1);
  if (0 < this->m_numDrawVertices) {
    pvVar6 = (vertexBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_hostPtr;
    lVar17 = 0;
    lVar19 = 0;
    do {
      puVar1 = (undefined8 *)
               ((long)((this->m_vertexPosData).
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar17);
      uVar8 = puVar1[1];
      puVar2 = (undefined8 *)((long)pvVar6 + lVar17 * 2);
      *puVar2 = *puVar1;
      puVar2[1] = uVar8;
      puVar1 = (undefined8 *)
               ((long)((this->m_vertexAttrData).
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar17);
      uVar8 = puVar1[1];
      puVar2 = (undefined8 *)((long)pvVar6 + lVar17 * 2 + 0x10);
      *puVar2 = *puVar1;
      puVar2[1] = uVar8;
      lVar19 = lVar19 + 1;
      lVar17 = lVar17 + 0x10;
    } while (lVar19 < this->m_numDrawVertices);
  }
  ::vk::flushMappedMemoryRange
            (vk,device,
             (VkDeviceMemory)
             ((vertexBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (vertexBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,bufferSize_00);
  beginCommandBuffer(vk,(VkCommandBuffer)CONCAT44(local_368[1],local_368[0]));
  subresourceRange_00.levelCount = 1;
  subresourceRange_00.baseArrayLayer = 0;
  subresourceRange_00.aspectMask = 1;
  subresourceRange_00.baseMipLevel = 0;
  subresourceRange_00.layerCount = 1;
  makeImageMemoryBarrier
            (&colorAttachmentLayoutBarrier,0,0x100,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
             (VkImage)colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                      m_data.object.m_internal,subresourceRange_00);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,CONCAT44(local_368[1],local_368[0]),1,0x80,0,0,0,0,0,1,
             (int)&colorAttachmentLayoutBarrier);
  colorAttachmentLayoutBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorAttachmentLayoutBarrier._4_4_ = 0;
  colorAttachmentLayoutBarrier.pNext = (void *)resolution.m_data;
  clearColor.m_data[0] = 0.0;
  clearColor.m_data[1] = 0.0;
  clearColor.m_data[2] = 0.0;
  clearColor.m_data[3] = 1.0;
  beginRenderPass(vk,(VkCommandBuffer)CONCAT44(local_368[1],local_368[0]),(VkRenderPass)renderPass,
                  local_198,(VkRect2D *)&colorAttachmentLayoutBarrier,&clearColor);
  (*vk->_vptr_DeviceInterface[0x4c])(vk,CONCAT44(local_368[1],local_368[0]),0,obj.m_internal);
  colorAttachmentLayoutBarrier._0_8_ =
       vertexBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  clearColor.m_data[0] = 0.0;
  clearColor.m_data[1] = 0.0;
  (*vk->_vptr_DeviceInterface[0x58])(vk,CONCAT44(local_368[1],local_368[0]),0,1);
  (*(this->super_TestInstance)._vptr_TestInstance[4])
            (this,vk,device,local_340,local_368,&pipelineLayout);
  (*(this->super_TestInstance)._vptr_TestInstance[5])(this,local_368);
  endRenderPass(vk,(VkCommandBuffer)CONCAT44(local_368[1],local_368[0]));
  subresourceRange_01.levelCount = 1;
  subresourceRange_01.baseArrayLayer = 0;
  subresourceRange_01.aspectMask = 1;
  subresourceRange_01.baseMipLevel = 0;
  subresourceRange_01.layerCount = 1;
  makeImageMemoryBarrier
            (&colorAttachmentLayoutBarrier,0x100,0x800,VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
             VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
             (VkImage)colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                      m_data.object.m_internal,subresourceRange_01);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,CONCAT44(local_368[1],local_368[0]),0x400,0x1000,0,0,0,0,0,1,
             (int)&colorAttachmentLayoutBarrier);
  subresourceLayers.baseArrayLayer = 0;
  subresourceLayers.layerCount = 1;
  subresourceLayers.aspectMask = 1;
  subresourceLayers.mipLevel = 0;
  extent.depth = 1;
  extent.width = resolution.m_data[0];
  extent.height = resolution.m_data[1];
  makeBufferImageCopy((VkBufferImageCopy *)&colorAttachmentLayoutBarrier,extent,subresourceLayers);
  (*vk->_vptr_DeviceInterface[99])
            (vk,CONCAT44(local_368[1],local_368[0]),
             colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
             object.m_internal,6,
             colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,1,(int)&colorAttachmentLayoutBarrier);
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)&colorAttachmentLayoutBarrier,0x1000,0x2000,
             (VkBuffer)
             colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,bufferSize);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,CONCAT44(local_368[1],local_368[0]),0x1000,0x4000,0,0,0,1,
             &colorAttachmentLayoutBarrier,0,0);
  endCommandBuffer(vk,(VkCommandBuffer)CONCAT44(local_368[1],local_368[0]));
  submitCommandsAndWait(vk,device,local_288,(VkCommandBuffer)CONCAT44(local_368[1],local_368[0]));
  pAVar9 = colorBuffer.m_allocation.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            (vk,device,
             (VkDeviceMemory)
             ((colorBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (colorBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,bufferSize);
  clearColor.m_data._0_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)&colorAttachmentLayoutBarrier,(TextureFormat *)&clearColor,
             resolution.m_data[0],resolution.m_data[1],1,pAVar9->m_hostPtr);
  context = (this->super_TestInstance).m_context;
  pcVar7 = (this->m_name)._M_dataplus._M_p;
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_278,pcVar7,pcVar7 + (this->m_name)._M_string_length);
  bVar11 = compareWithFileImage
                     (context,(ConstPixelBufferAccess *)&colorAttachmentLayoutBarrier,&local_278);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  pTVar10 = local_290;
  if (!bVar11) {
    clearColor.m_data._0_8_ = &local_378;
    std::__cxx11::string::_M_construct<char_const*>((string *)&clearColor,"Fail","");
    pTVar10->m_code = QP_TEST_RESULT_FAIL;
    (pTVar10->m_description)._M_dataplus._M_p = (pointer)&(pTVar10->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar10->m_description,clearColor.m_data._0_8_,
               clearColor.m_data._8_8_ + clearColor.m_data._0_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)clearColor.m_data._0_8_ != &local_378) {
      operator_delete((void *)clearColor.m_data._0_8_,local_378._M_allocated_capacity + 1);
    }
    if (!bVar11) goto LAB_00a0fafd;
  }
  colorAttachmentLayoutBarrier._0_8_ = &colorAttachmentLayoutBarrier.srcAccessMask;
  std::__cxx11::string::_M_construct<char_const*>((string *)&colorAttachmentLayoutBarrier,"Pass","")
  ;
  pTVar10->m_code = QP_TEST_RESULT_PASS;
  (pTVar10->m_description)._M_dataplus._M_p = (pointer)&(pTVar10->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pTVar10->m_description,colorAttachmentLayoutBarrier._0_8_,
             (long)colorAttachmentLayoutBarrier.pNext + colorAttachmentLayoutBarrier._0_8_);
  if ((VkAccessFlags *)colorAttachmentLayoutBarrier._0_8_ !=
      &colorAttachmentLayoutBarrier.srcAccessMask) {
    operator_delete((void *)colorAttachmentLayoutBarrier._0_8_,
                    CONCAT44(colorAttachmentLayoutBarrier.dstAccessMask,
                             colorAttachmentLayoutBarrier.srcAccessMask) + 1);
  }
LAB_00a0fafd:
  if (vertexBuffer.m_allocation.
      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr !=
      (Allocation *)0x0) {
    (*(vertexBuffer.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
      _vptr_Allocation[1])();
    vertexBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (vertexBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
      != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&vertexBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               vertexBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  if (colorBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
      .m_data.ptr != (Allocation *)0x0) {
    (*(colorBuffer.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
      _vptr_Allocation[1])();
    colorBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal !=
      0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&DStack_1d0,(VkPipeline)obj.m_internal);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)geometryShaderName._M_dataplus._M_p != &geometryShaderName.field_2) {
    operator_delete(geometryShaderName._M_dataplus._M_p,
                    geometryShaderName.field_2._M_allocated_capacity + 1);
  }
  if (CONCAT44(local_368[1],local_368[0]) != 0) {
    colorAttachmentLayoutBarrier._0_8_ = CONCAT44(local_368[1],local_368[0]);
    (**(code **)(*(long *)CONCAT44(uStack_35c,uStack_360) + 0x240))
              ((long *)CONCAT44(uStack_35c,uStack_360),CONCAT44(VStack_354,local_358),
               CONCAT44(VStack_34c,VStack_350),1);
  }
  if (local_1b8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_1b0,local_1b8);
  }
  if (local_198.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()(&DStack_190,local_198);
  }
  if (local_178.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()(&DStack_170,local_178);
  }
  if (pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              (&pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter,
               (VkPipelineLayout)
               pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
               m_internal);
  }
  if (renderPass != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              (&DStack_2b0,(VkRenderPass)renderPass);
  }
  if (colorAttachmentImage.m_allocation.
      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr !=
      (Allocation *)0x0) {
    (*(colorAttachmentImage.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
      _vptr_Allocation[1])();
    colorAttachmentImage.m_allocation.
    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
         (Allocation *)0x0;
  }
  if (colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
      m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                deleter,(VkImage)colorAttachmentImage.m_image.
                                 super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                                 m_internal);
  }
  return pTVar10;
}

Assistant:

tcu::TestStatus GeometryExpanderRenderTestInstance::iterate (void)
{
	const DeviceInterface&			vk						= m_context.getDeviceInterface();
	const VkDevice					device					= m_context.getDevice();
	const deUint32					queueFamilyIndex		= m_context.getUniversalQueueFamilyIndex();
	const VkQueue					queue					= m_context.getUniversalQueue();
	Allocator&						memAlloc				= m_context.getDefaultAllocator();
	const IVec2						resolution				= IVec2(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	const VkFormat					colorFormat				= VK_FORMAT_R8G8B8A8_UNORM;
	const Image						colorAttachmentImage	(
																vk,
																device,
																memAlloc,
																makeImageCreateInfo(resolution, colorFormat, VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_BUFFER_USAGE_TRANSFER_SRC_BIT),
																MemoryRequirement::Any
															);
	const Unique<VkRenderPass>		renderPass				(makeRenderPass(vk, device, colorFormat));

	const Move<VkPipelineLayout>	pipelineLayout			(createPipelineLayout(vk, device));
	const VkImageSubresourceRange	colorSubRange			= makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u);
	const Unique<VkImageView>		colorAttachmentView		(makeImageView(vk, device, *colorAttachmentImage, VK_IMAGE_VIEW_TYPE_2D, colorFormat, colorSubRange));
	const Unique<VkFramebuffer>		framebuffer				(makeFramebuffer(vk, device, *renderPass, *colorAttachmentView, resolution.x(), resolution.y(), 1u));
	const Unique<VkCommandPool>		cmdPool					(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer				(allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	const VkDeviceSize				vertexDataSizeBytes		= sizeInBytes(m_vertexPosData) + sizeInBytes(m_vertexAttrData);
	const deUint32					vertexPositionsOffset	= 0u;
	const deUint32					vertexAtrrOffset		= static_cast<deUint32>(sizeof(Vec4));
	const string					geometryShaderName		= (m_context.getBinaryCollection().contains("geometry_pointsize") && checkPointSize (m_context.getInstanceInterface(), m_context.getPhysicalDevice()))?
																"geometry_pointsize" : "geometry";

	const Unique<VkPipeline>		pipeline				(GraphicsPipelineBuilder()
																.setRenderSize			(resolution)
																.setShader				(vk, device, VK_SHADER_STAGE_VERTEX_BIT, m_context.getBinaryCollection().get("vertex"), DE_NULL)
																.setShader				(vk, device, VK_SHADER_STAGE_GEOMETRY_BIT, m_context.getBinaryCollection().get(geometryShaderName), DE_NULL)
																.setShader				(vk, device, VK_SHADER_STAGE_FRAGMENT_BIT, m_context.getBinaryCollection().get("fragment"), DE_NULL)
																.addVertexBinding		(makeVertexInputBindingDescription(0u, 2u*vertexAtrrOffset, VK_VERTEX_INPUT_RATE_VERTEX))
																.addVertexAttribute		(makeVertexInputAttributeDescription(0u, 0u, VK_FORMAT_R32G32B32A32_SFLOAT, vertexPositionsOffset))
																.addVertexAttribute		(makeVertexInputAttributeDescription(1u, 0u, VK_FORMAT_R32G32B32A32_SFLOAT, vertexAtrrOffset))
																.setPrimitiveTopology	(m_primitiveType)
																.build					(vk, device, *pipelineLayout, *renderPass));

	const VkDeviceSize				colorBufferSizeBytes	= resolution.x()*resolution.y() * tcu::getPixelSize(mapVkFormat(colorFormat));
	const Buffer					colorBuffer				(vk, device, memAlloc, makeBufferCreateInfo(colorBufferSizeBytes,
																VK_BUFFER_USAGE_TRANSFER_DST_BIT), MemoryRequirement::HostVisible);
	const Buffer					vertexBuffer			(vk, device, memAlloc, makeBufferCreateInfo(vertexDataSizeBytes,
																VK_BUFFER_USAGE_VERTEX_BUFFER_BIT ), MemoryRequirement::HostVisible);
	{
		const Allocation& alloc = vertexBuffer.getAllocation();
		struct DataVec4
		{
			Vec4 pos;
			Vec4 color;
		};

		DataVec4* const pData = static_cast<DataVec4*>(alloc.getHostPtr());
		for(int ndx = 0; ndx < m_numDrawVertices; ++ndx)
		{
			pData[ndx].pos = m_vertexPosData[ndx];
			pData[ndx].color = m_vertexAttrData[ndx];
		}
		flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), vertexDataSizeBytes);
		// No barrier needed, flushed memory is automatically visible
	}

	// Draw commands
	beginCommandBuffer(vk, *cmdBuffer);

	// Change color attachment image layout
	{
		const VkImageMemoryBarrier colorAttachmentLayoutBarrier = makeImageMemoryBarrier(
				(VkAccessFlags)0, VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,
				VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
				*colorAttachmentImage, colorSubRange);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT, 0u,
						0u, DE_NULL, 0u, DE_NULL, 1u, &colorAttachmentLayoutBarrier);
	}

	// Begin render pass
	{
		const VkRect2D renderArea = {
				makeOffset2D(0, 0),
				makeExtent2D(resolution.x(), resolution.y()),
			};
			const tcu::Vec4 clearColor(0.0f, 0.0f, 0.0f, 1.0f);
			beginRenderPass(vk, *cmdBuffer, *renderPass, *framebuffer, renderArea, clearColor);
	}

	vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
	{
		const VkBuffer buffers[] = { vertexBuffer.get()};
		const VkDeviceSize offsets[] = { vertexPositionsOffset };
		vk.cmdBindVertexBuffers(*cmdBuffer, 0u, DE_LENGTH_OF_ARRAY(buffers), buffers, offsets);
	}

	bindDescriptorSets(vk, device, memAlloc, *cmdBuffer, *pipelineLayout);

	drawCommand (*cmdBuffer);
	endRenderPass(vk, *cmdBuffer);

	// Copy render result to a host-visible buffer
	{
		const VkImageMemoryBarrier colorAttachmentPreCopyBarrier = makeImageMemoryBarrier(
				VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT, VK_ACCESS_TRANSFER_READ_BIT,
				VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
				*colorAttachmentImage, colorSubRange);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u,
				0u, DE_NULL, 0u, DE_NULL, 1u, &colorAttachmentPreCopyBarrier);
	}
	{
		const VkBufferImageCopy copyRegion = makeBufferImageCopy(makeExtent3D(resolution.x(), resolution.y(), 1), makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, 1u));
		vk.cmdCopyImageToBuffer(*cmdBuffer, *colorAttachmentImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *colorBuffer, 1u, &copyRegion);
	}

	{
		const VkBufferMemoryBarrier postCopyBarrier = makeBufferMemoryBarrier(VK_ACCESS_TRANSFER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *colorBuffer, 0ull, colorBufferSizeBytes);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
			0u, DE_NULL, 1u, &postCopyBarrier, 0u, DE_NULL);
	}

	endCommandBuffer(vk, *cmdBuffer);
	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	{
		// Log the result image.
		const Allocation& colorBufferAlloc = colorBuffer.getAllocation();
		invalidateMappedMemoryRange(vk, device, colorBufferAlloc.getMemory(), colorBufferAlloc.getOffset(), colorBufferSizeBytes);
		const tcu::ConstPixelBufferAccess imagePixelAccess(mapVkFormat(colorFormat), resolution.x(), resolution.y(), 1, colorBufferAlloc.getHostPtr());

		if (!compareWithFileImage(m_context, imagePixelAccess, m_name))
			return TestStatus::fail("Fail");
	}

	return TestStatus::pass("Pass");
}